

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O0

void __thiscall
cfd::ConfidentialTransactionContext::SignWithPrivkeySimple
          (ConfidentialTransactionContext *this,OutPoint *outpoint,Pubkey *pubkey,Privkey *privkey,
          SigHashType *sighash_type,Amount *value,AddressType address_type,bool has_grind_r)

{
  SigHashType *in_R8;
  Amount *in_R9;
  byte in_stack_00000010;
  bool in_stack_00000067;
  ConfidentialValue *in_stack_00000068;
  SigHashType *in_stack_00000070;
  Privkey *in_stack_00000078;
  Pubkey *in_stack_00000080;
  OutPoint *in_stack_00000088;
  undefined7 in_stack_00000090;
  ConfidentialValue local_68;
  SigHashType local_40;
  byte local_31;
  Amount *local_30;
  
  local_31 = in_stack_00000010 & 1;
  local_30 = in_R9;
  core::SigHashType::SigHashType(&local_40,in_R8);
  core::ConfidentialValue::ConfidentialValue(&local_68,local_30);
  SignWithPrivkeySimple
            ((ConfidentialTransactionContext *)CONCAT17(has_grind_r,in_stack_00000090),
             in_stack_00000088,in_stack_00000080,in_stack_00000078,in_stack_00000070,
             in_stack_00000068,(AddressType)sighash_type,in_stack_00000067);
  core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)0x5551e4);
  return;
}

Assistant:

void ConfidentialTransactionContext::SignWithPrivkeySimple(
    const OutPoint& outpoint, const Pubkey& pubkey, const Privkey& privkey,
    SigHashType sighash_type, const Amount& value, AddressType address_type,
    bool has_grind_r) {
  SignWithPrivkeySimple(
      outpoint, pubkey, privkey, sighash_type, ConfidentialValue(value),
      address_type, has_grind_r);
}